

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

int cmIsOn(void *arg,char *name)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_31);
  bVar1 = cmMakefile::IsOn((cmMakefile *)arg,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (int)bVar1;
}

Assistant:

int CCONV cmIsOn(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return static_cast<int>(mf->IsOn(name));
}